

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O3

int gost_ciphers(ENGINE *e,EVP_CIPHER **cipher,int **nids,int nid)

{
  int iVar1;
  long lVar2;
  EVP_CIPHER *pEVar3;
  
  if (cipher == (EVP_CIPHER **)0x0) {
    *nids = known_cipher_nids;
    lVar2 = 0;
    do {
      *(undefined4 *)((long)known_cipher_nids + lVar2) =
           *(undefined4 *)(*(long *)((long)gost_cipher_array + lVar2 * 2) + 8);
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x50);
    iVar1 = 0x14;
  }
  else {
    lVar2 = 0;
    do {
      if (gost_cipher_array[lVar2]->nid == nid) {
        pEVar3 = GOST_init_cipher(gost_cipher_array[lVar2]);
        iVar1 = 1;
        goto LAB_0010e300;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x14);
    pEVar3 = (EVP_CIPHER *)0x0;
    iVar1 = 0;
LAB_0010e300:
    *cipher = pEVar3;
  }
  return iVar1;
}

Assistant:

static int gost_ciphers(ENGINE *e, const EVP_CIPHER **cipher,
                        const int **nids, int nid)
{
    int i;

    if (!cipher) {
        int *n = known_cipher_nids;

        *nids = n;
        for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
            *n++ = gost_cipher_array[i]->nid;
        return i;
    }

    for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
        if (nid == gost_cipher_array[i]->nid) {
            *cipher = GOST_init_cipher(gost_cipher_array[i]);
            return 1;
        }
    *cipher = NULL;
    return 0;
}